

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O2

void __thiscall fineftp::FtpSession::handleFtpCommandNLST(FtpSession *this,string *param)

{
  element_type *peVar1;
  bool bVar2;
  FileType FVar3;
  FileStatus *this_00;
  string local_path;
  FileStatus dir_status;
  allocator local_119;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
  local_118;
  string local_e8;
  FileStatus local_c8;
  
  peVar1 = (this->logged_in_user_).super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    ::std::__cxx11::string::string((string *)&local_c8,"Not logged in",(allocator *)&local_118);
    sendFtpMessage(this,NOT_LOGGED_IN,&local_c8.path_);
  }
  else {
    if ((peVar1->permissions_ & DirList) != None) {
      toLocalPath(&local_e8,this,param);
      Filesystem::FileStatus::FileStatus(&local_c8,(string *)&local_e8);
      bVar2 = Filesystem::FileStatus::isOk(&local_c8);
      if (bVar2) {
        FVar3 = Filesystem::FileStatus::type(&local_c8);
        if (FVar3 != Dir) {
          ::std::__cxx11::string::string((string *)&local_118,"Path is not a directory",&local_119);
          sendFtpMessage(this,FILE_ACTION_NOT_TAKEN,(string *)&local_118);
          goto LAB_00115646;
        }
        bVar2 = Filesystem::FileStatus::canOpenDir(&local_c8);
        if (!bVar2) {
          ::std::__cxx11::string::string((string *)&local_118,"Permission denied",&local_119);
          sendFtpMessage(this,FILE_ACTION_NOT_TAKEN,(string *)&local_118);
          goto LAB_00115646;
        }
        ::std::__cxx11::string::string((string *)&local_118,"Sending name list",&local_119);
        sendFtpMessage(this,FILE_STATUS_OK_OPENING_DATA_CONNECTION,(string *)&local_118);
        ::std::__cxx11::string::~string((string *)&local_118);
        Filesystem::dirContent
                  ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
                    *)&local_118,(string *)&local_e8);
        sendNameList(this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
                           *)&local_118);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
        ::~_Rb_tree(&local_118);
      }
      else {
        ::std::__cxx11::string::string((string *)&local_118,"Path does not exist",&local_119);
        sendFtpMessage(this,FILE_ACTION_NOT_TAKEN,(string *)&local_118);
LAB_00115646:
        ::std::__cxx11::string::~string((string *)&local_118);
      }
      Filesystem::FileStatus::~FileStatus(&local_c8);
      this_00 = (FileStatus *)&local_e8;
      goto LAB_0011565f;
    }
    ::std::__cxx11::string::string((string *)&local_c8,"Permission denied",(allocator *)&local_118);
    sendFtpMessage(this,FILE_ACTION_NOT_TAKEN,&local_c8.path_);
  }
  this_00 = &local_c8;
LAB_0011565f:
  ::std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void FtpSession::handleFtpCommandNLST(const std::string& param)
  {
    if (!logged_in_user_)
    {
      sendFtpMessage(FtpReplyCode::NOT_LOGGED_IN,    "Not logged in");
      return;
    }

    // RFC 959 does not allow ACTION_NOT_TAKEN (-> permanent error), so we return a temporary error (FILE_ACTION_NOT_TAKEN).
    if (static_cast<int>(logged_in_user_->permissions_ & Permission::DirList) == 0)
    {
      sendFtpMessage(FtpReplyCode::FILE_ACTION_NOT_TAKEN, "Permission denied");
      return;
    }

    std::string local_path = toLocalPath(param);
    auto dir_status = Filesystem::FileStatus(local_path);

    if (dir_status.isOk())
    {
      if (dir_status.type() == Filesystem::FileType::Dir)
      {
        if (dir_status.canOpenDir())
        {
          sendFtpMessage(FtpReplyCode::FILE_STATUS_OK_OPENING_DATA_CONNECTION, "Sending name list");
          sendNameList(Filesystem::dirContent(local_path));
          return;
        }
        else
        {
          sendFtpMessage(FtpReplyCode::FILE_ACTION_NOT_TAKEN, "Permission denied");
          return;
        }
      }
      else
      {
        // TODO: RFC959: If the pathname specifies a file then the server should send current information on the file.
        sendFtpMessage(FtpReplyCode::FILE_ACTION_NOT_TAKEN, "Path is not a directory");
        return;
      }
    }
    else
    {
      sendFtpMessage(FtpReplyCode::FILE_ACTION_NOT_TAKEN, "Path does not exist");
      return;
    }
  }